

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service_base.hpp
# Opt level: O3

void __thiscall
asio::detail::reactive_socket_service_base::
start_op<asio::detail::reactive_socket_recv_op<asio::mutable_buffers_1,std::function<void(std::error_code_const&,unsigned_long)>,asio::any_io_executor>>
          (reactive_socket_service_base *this,base_implementation_type *impl,int op_type,
          reactive_socket_recv_op<asio::mutable_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor>
          *op,bool is_continuation,bool allow_speculative,bool noop,bool needs_non_blocking,
          void *param_8,
          enable_if_t<is_same<typename_associated_immediate_executor<typename_reactive_socket_recv_op<mutable_buffers_1,_function<void_(const_error_code_&,_unsigned_long)>,_any_io_executor>::handler_type,_typename_reactive_socket_recv_op<mutable_buffers_1,_function<void_(const_error_code_&,_unsigned_long)>,_any_io_executor>::io_executor_type>::asio_associated_immediate_executor_is_unspecialised,_void>::value>
          *param_9)

{
  atomic_count *paVar1;
  reactor *prVar2;
  per_descriptor_data pdVar3;
  bool bVar4;
  status sVar5;
  int iVar6;
  reactor *prVar7;
  per_descriptor_data pdVar8;
  int *piVar9;
  error_category *peVar10;
  reactor_op *prVar11;
  uint uVar12;
  scheduler *this_00;
  uint local_3c;
  per_descriptor_data local_38;
  
  prVar2 = this->reactor_;
  if (noop) {
LAB_003c7623:
    this_00 = prVar2->scheduler_;
LAB_003c762b:
    scheduler::post_immediate_completion(this_00,(operation *)op,is_continuation);
    return;
  }
  prVar7 = prVar2;
  if (needs_non_blocking && (impl->state_ & 3) == 0) {
    bVar4 = socket_ops::set_internal_non_blocking
                      (impl->socket_,&impl->state_,true,
                       &(op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).
                        super_reactor_op.ec_);
    if (!bVar4) goto LAB_003c7623;
    prVar7 = this->reactor_;
  }
  pdVar3 = impl->reactor_data_;
  if (pdVar3 == (per_descriptor_data)0x0) {
    std::error_code::operator=
              (&(op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.
                ec_,bad_descriptor);
    this_00 = prVar2->scheduler_;
    goto LAB_003c762b;
  }
  iVar6 = impl->socket_;
  bVar4 = (pdVar3->mutex_).enabled_ == true;
  pdVar8 = pdVar3;
  if (bVar4) {
    pthread_mutex_lock((pthread_mutex_t *)&(pdVar3->mutex_).mutex_);
    pdVar8 = impl->reactor_data_;
  }
  if (pdVar8->shutdown_ == false) {
    if (pdVar8->op_queue_[op_type].front_ != (reactor_op *)0x0) {
LAB_003c7711:
      (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.
      super_operation.next_ = (scheduler_operation *)0x0;
      prVar11 = pdVar8->op_queue_[op_type].back_;
      if (prVar11 == (reactor_op *)0x0) {
        prVar11 = (reactor_op *)(pdVar8->op_queue_ + op_type);
      }
      (prVar11->super_operation).next_ = (scheduler_operation *)op;
      pdVar8->op_queue_[op_type].back_ = (reactor_op *)op;
      LOCK();
      paVar1 = &prVar7->scheduler_->outstanding_work_;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
      goto LAB_003c7747;
    }
    if (allow_speculative) {
      if ((op_type == 0) && (pdVar8->op_queue_[2].front_ != (reactor_op *)0x0)) {
        uVar12 = pdVar8->registered_events_;
        if (uVar12 != 0) goto LAB_003c7845;
      }
      else {
        if (pdVar8->try_speculative_[op_type] == true) {
          sVar5 = (*(op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).
                    super_reactor_op.perform_func_)((reactor_op *)op);
          if (sVar5 == done_and_exhausted) {
            if (impl->reactor_data_->registered_events_ != 0) {
              impl->reactor_data_->try_speculative_[op_type] = false;
            }
          }
          else if (sVar5 == not_done) {
            pdVar8 = impl->reactor_data_;
            goto LAB_003c77a4;
          }
          if (bVar4) {
            if ((pdVar3->mutex_).enabled_ == true) {
              pthread_mutex_unlock((pthread_mutex_t *)&(pdVar3->mutex_).mutex_);
            }
            bVar4 = false;
          }
          scheduler::post_immediate_completion(prVar2->scheduler_,(operation *)op,is_continuation);
          goto LAB_003c7747;
        }
LAB_003c77a4:
        uVar12 = pdVar8->registered_events_;
        if (uVar12 != 0) {
          if ((op_type == 1) && ((uVar12 & 4) == 0)) {
            local_3c = uVar12 | 4;
            local_38 = pdVar8;
            iVar6 = epoll_ctl(prVar7->epoll_fd_,3,iVar6,(epoll_event *)&local_3c);
            if (iVar6 != 0) {
              piVar9 = __errno_location();
              iVar6 = *piVar9;
              peVar10 = error::get_system_category();
              (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.ec_
              ._M_value = iVar6;
              (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.ec_
              ._M_cat = peVar10;
              scheduler::post_immediate_completion
                        (prVar2->scheduler_,(operation *)op,is_continuation);
              goto LAB_003c7747;
            }
            pdVar8 = impl->reactor_data_;
            pdVar8->registered_events_ = pdVar8->registered_events_ | local_3c;
          }
          goto LAB_003c7711;
        }
      }
    }
    else {
      uVar12 = pdVar8->registered_events_;
      if (uVar12 != 0) {
        if (op_type == 1) {
          uVar12 = uVar12 | 4;
          pdVar8->registered_events_ = uVar12;
        }
LAB_003c7845:
        local_3c = uVar12;
        local_38 = pdVar8;
        epoll_ctl(prVar7->epoll_fd_,3,iVar6,(epoll_event *)&local_3c);
        pdVar8 = impl->reactor_data_;
        goto LAB_003c7711;
      }
    }
    std::error_code::operator=
              (&(op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.
                ec_,operation_not_supported);
  }
  scheduler::post_immediate_completion(prVar2->scheduler_,(operation *)op,is_continuation);
LAB_003c7747:
  if (bVar4) {
    pthread_mutex_unlock((pthread_mutex_t *)&(pdVar3->mutex_).mutex_);
  }
  return;
}

Assistant:

void start_op(base_implementation_type& impl, int op_type,
      Op* op, bool is_continuation, bool allow_speculative,
      bool noop, bool needs_non_blocking, const void*,
      enable_if_t<
        is_same<
          typename associated_immediate_executor<
            typename Op::handler_type,
            typename Op::io_executor_type
          >::asio_associated_immediate_executor_is_unspecialised,
          void
        >::value
      >*)
  {
    return do_start_op(impl, op_type, op, is_continuation,
        allow_speculative, noop, needs_non_blocking,
        &reactor::call_post_immediate_completion, &reactor_);
  }